

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

int __thiscall Bstrlib::String::reverseFind(String *this,char c,int pos)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  
  iVar1 = (this->super_tagbstring).slen;
  iVar3 = iVar1 + -1;
  if (-1 < pos) {
    iVar3 = pos;
  }
  uVar2 = 0xffffffff;
  if (iVar3 <= iVar1) {
    for (uVar4 = iVar3 - (uint)(iVar3 == iVar1);
        (uVar2 = 0xffffffff, -1 < (int)uVar4 &&
        (uVar2 = uVar4, (this->super_tagbstring).data[uVar4] != c)); uVar4 = uVar4 - 1) {
    }
  }
  return uVar2;
}

Assistant:

int String::reverseFind(char c, int pos) const
    {
        if (pos < 0) pos = slen-1;
        if (pos > slen)            return BSTR_ERR;
        if (pos == slen)        pos--;
        for (; pos >= 0; pos--)
        {
            if (data[pos] ==(unsigned char) c)    return pos;
        }
        return BSTR_ERR;
    }